

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Literal * __thiscall wasm::Literal::convertSIToF64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  double dVar2;
  
  uVar1 = (this->type).id;
  if (uVar1 == 3) {
    dVar2 = (double)(this->field_0).i64;
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x2eb);
    }
    dVar2 = (double)(this->field_0).i32;
  }
  *(double *)&__return_storage_ptr__->field_0 = dVar2;
  (__return_storage_ptr__->type).id = 5;
  return __return_storage_ptr__;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }